

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConcatenationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConcatenationExpressionSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_1,Token *args_2)

{
  Token openBrace;
  Token closeBrace;
  ConcatenationExpressionSyntax *this_00;
  
  this_00 = (ConcatenationExpressionSyntax *)allocate(this,0x70,8);
  openBrace.kind = args->kind;
  openBrace._2_1_ = args->field_0x2;
  openBrace.numFlags.raw = (args->numFlags).raw;
  openBrace.rawLen = args->rawLen;
  openBrace.info = args->info;
  closeBrace.kind = args_2->kind;
  closeBrace._2_1_ = args_2->field_0x2;
  closeBrace.numFlags.raw = (args_2->numFlags).raw;
  closeBrace.rawLen = args_2->rawLen;
  closeBrace.info = args_2->info;
  slang::syntax::ConcatenationExpressionSyntax::ConcatenationExpressionSyntax
            (this_00,openBrace,args_1,closeBrace);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }